

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_define(CTcTokenizer *this)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  uint uVar3;
  wchar_t wVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  _func_int **pp_Var8;
  CVmHashTable *this_00;
  size_t expan_len_00;
  long *plVar9;
  CTcHashEntryPp *this_01;
  CTcHashEntryPp *pCVar10;
  textchar_t *in_RDI;
  tc_toktyp_t tok;
  int done;
  int has_varargs;
  CTcHashEntryPp *old_entry;
  CTcHashEntryPp *entry;
  size_t expan_len;
  char *expan;
  int has_args;
  int argc;
  size_t argvlen [128];
  char *argv [128];
  size_t macro_len;
  char *macro_name;
  int in_stack_fffffffffffff73c;
  CTcTokenizer *in_stack_fffffffffffff740;
  CTcTokenizer *this_02;
  CVmHashEntry *entry_00;
  size_t in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff780;
  undefined2 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff792;
  byte bVar11;
  undefined4 in_stack_fffffffffffff794;
  CTcHashEntryPpDefine *in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7b0;
  tc_toktyp_t local_84c;
  int in_stack_fffffffffffff7b8;
  undefined4 uVar12;
  size_t *in_stack_fffffffffffff7c0;
  char *in_stack_fffffffffffff7c8;
  int local_81c;
  CVmHashEntry local_818;
  size_t local_18;
  CTcTokFileDesc *local_10;
  
  tVar2 = next_on_line((CTcTokenizer *)0x294991);
  if (tVar2 != TOKT_SYM) {
    sVar6 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
    uVar3 = (uint)sVar6;
    pcVar7 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
    log_error(0x2718,(ulong)uVar3,pcVar7);
    clear_linebuf(in_stack_fffffffffffff740);
    return;
  }
  local_10 = (CTcTokFileDesc *)CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
  local_18 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
  local_81c = 0;
  uVar12 = 0;
  wVar4 = utf8_ptr::getch((utf8_ptr *)0x294a37);
  if (wVar4 == L'(') {
    bVar1 = true;
    in_stack_fffffffffffff7b8 = 0;
    utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffff740);
    local_84c = next_on_line((CTcTokenizer *)0x294a71);
    if (local_84c == TOKT_RPAR) {
      in_stack_fffffffffffff7b8 = 1;
    }
    while (in_stack_fffffffffffff7b8 == 0) {
      if (0x7f < local_81c) {
        log_error(0x2735,local_10,local_18,0x80);
        clear_linebuf(in_stack_fffffffffffff740);
        return;
      }
      if (local_84c == TOKT_EOF) {
        log_error(0x271a);
        clear_linebuf(in_stack_fffffffffffff740);
        return;
      }
      if (local_84c != TOKT_SYM) {
        log_error_curtok(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
        clear_linebuf(in_stack_fffffffffffff740);
        return;
      }
      pp_Var8 = (_func_int **)CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      (&local_818._vptr_CVmHashEntry)[local_81c] = pp_Var8;
      pcVar7 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
      *(char **)(&stack0xfffffffffffffbe8 + (long)local_81c * 8) = pcVar7;
      tVar2 = next_on_line((CTcTokenizer *)0x294b82);
      if (tVar2 == TOKT_COMMA) {
        local_84c = next_on_line((CTcTokenizer *)0x294b97);
        local_81c = local_81c + 1;
      }
      else {
        if (tVar2 == TOKT_ELLIPSIS) {
          tVar2 = next_on_line((CTcTokenizer *)0x294bb1);
          uVar12 = 1;
          if (tVar2 != TOKT_RPAR) {
            log_error_curtok(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
            clear_linebuf(in_stack_fffffffffffff740);
            return;
          }
        }
        else if (tVar2 != TOKT_RPAR) {
          log_error_curtok(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
          clear_linebuf(in_stack_fffffffffffff740);
          return;
        }
        local_84c = TOKT_RPAR;
        in_stack_fffffffffffff7b8 = 1;
        local_81c = local_81c + 1;
      }
    }
  }
  else {
    bVar1 = false;
  }
  while( true ) {
    utf8_ptr::getch((utf8_ptr *)0x294c4d);
    iVar5 = is_space(L'\0');
    if (iVar5 == 0) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffff740);
  }
  this_00 = (CVmHashTable *)utf8_ptr::getptr((utf8_ptr *)(in_RDI + 0x90));
  if ((local_18 == 7) && (iVar5 = memcmp(local_10,"defined",7), iVar5 == 0)) {
    log_error(0x2742);
    clear_linebuf(in_stack_fffffffffffff740);
    return;
  }
  expan_len_00 = strlen((char *)this_00);
  while( true ) {
    bVar11 = 0;
    if (expan_len_00 != 0) {
      iVar5 = is_space(L'\0');
      bVar11 = 0;
      if (iVar5 != 0) {
        in_stack_fffffffffffff792 = false;
        if (1 < expan_len_00) {
          in_stack_fffffffffffff792 = *(char *)((long)this_00 + (expan_len_00 - 2)) == '\\';
        }
        bVar11 = in_stack_fffffffffffff792 ^ 0xff;
      }
    }
    iVar5 = (int)((ulong)in_stack_fffffffffffff780 >> 0x20);
    if ((bVar11 & 1) == 0) break;
    expan_len_00 = expan_len_00 - 1;
  }
  plVar9 = (long *)operator_new(0x68);
  entry_00 = &local_818;
  this_02 = (CTcTokenizer *)&stack0xfffffffffffffbe8;
  CTcHashEntryPpDefine::CTcHashEntryPpDefine
            (in_stack_fffffffffffff7a0,in_RDI,
             CONCAT44(in_stack_fffffffffffff794,
                      CONCAT13(bVar11,CONCAT12(in_stack_fffffffffffff792,in_stack_fffffffffffff790))
                     ),(int)((ulong)plVar9 >> 0x20),(int)plVar9,iVar5,in_stack_fffffffffffff7b0,
             (char **)CONCAT44(uVar12,in_stack_fffffffffffff7b8),in_stack_fffffffffffff7c0,
             in_stack_fffffffffffff7c8,expan_len_00);
  this_01 = find_define(this_02,(char *)CONCAT44(in_stack_fffffffffffff73c,uVar12),0x294e1d);
  if (this_01 != (CTcHashEntryPp *)0x0) {
    iVar5 = CTcHashEntryPp::has_args(this_01);
    if (((iVar5 != 0) == bVar1) && (iVar5 = CTcHashEntryPp::get_argc(this_01), iVar5 == local_81c))
    {
      sVar6 = (**(code **)(*plVar9 + 0x18))();
      pcVar7 = (char *)(**(code **)(*plVar9 + 0x20))();
      (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[3])();
      (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[4])();
      iVar5 = lib_strequal_collapse_spaces
                        (pcVar7,sVar6,in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      if (iVar5 != 0) {
        if (plVar9 != (long *)0x0) {
          (**(code **)(*plVar9 + 8))();
        }
        goto LAB_00294fd6;
      }
    }
    log_warning(0x271d,local_18 & 0xffffffff,local_10);
    (**(code **)(**(long **)(in_RDI + 0xd30) + 0x18))(*(long **)(in_RDI + 0xd30),this_01);
    pCVar10 = find_undef(this_02,(char *)CONCAT44(in_stack_fffffffffffff73c,uVar12),0x294f79);
    if (pCVar10 == (CTcHashEntryPp *)0x0) {
      CVmHashTable::add(this_00,entry_00);
    }
    else if (this_01 != (CTcHashEntryPp *)0x0) {
      (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[1])();
    }
  }
  (**(code **)(**(long **)(in_RDI + 0xd30) + 0x10))(*(long **)(in_RDI + 0xd30),plVar9);
LAB_00294fd6:
  clear_linebuf(this_02);
  return;
}

Assistant:

void CTcTokenizer::pp_define()
{
    const char *macro_name;
    size_t macro_len;
    const char *argv[TOK_MAX_MACRO_ARGS];
    size_t argvlen[TOK_MAX_MACRO_ARGS];
    int argc;
    int has_args;
    const char *expan;
    size_t expan_len;
    CTcHashEntryPp *entry, *old_entry;
    int has_varargs;

    /* get the macro name */
    if (next_on_line() != TOKT_SYM)
    {
        log_error(TCERR_BAD_DEFINE_SYM,
                  (int)curtok_.get_text_len(), curtok_.get_text());
        clear_linebuf();
        return;
    }

    /* make a copy of the macro name */
    macro_name = curtok_.get_text();
    macro_len = curtok_.get_text_len();

    /* no arguments yet */
    argc = 0;

    /* presume we won't find a varargs marker */
    has_varargs = FALSE;

    /* 
     *   If there's a '(' immediately after the macro name, without any
     *   intervening whitespace, it has arguments; otherwise, it has no
     *   arguments.  Note which case we have.  
     */
    if (p_.getch() == '(')
    {
        int done;
        tc_toktyp_t tok;
        
        /* note that we have an argument list */
        has_args = TRUE;

        /* assume we're not done yet */
        done = FALSE;

        /* skip the paren and get the next token */
        p_.inc();
        tok = next_on_line();

        /* check for an empty argument list */
        if (tok == TOKT_RPAR)
        {
            /* note that we're done with the arguments */
            done = TRUE;
        }

        /* scan the argument list */
        while (!done)
        {
            /* if we have too many arguments, it's an error */
            if (argc >= TOK_MAX_MACRO_ARGS)
            {
                log_error(TCERR_TOO_MANY_MAC_PARMS,
                          macro_name, macro_len, TOK_MAX_MACRO_ARGS);
                clear_linebuf();
                return;
            }

            /* if we're at the end of the macro, it's an error */
            if (tok == TOKT_EOF)
            {
                /* log the error and ignore the line */
                log_error(TCERR_MACRO_NO_RPAR);
                clear_linebuf();
                return;
            }

            /* check for a valid initial symbol character */
            if (tok != TOKT_SYM)
            {
                log_error_curtok(TCERR_BAD_MACRO_ARG_NAME);
                clear_linebuf();
                return;
            }

            /* remember the argument name */
            argvlen[argc] = curtok_.get_text_len();
            argv[argc++] = curtok_.get_text();

            /* get the next token */
            tok = next_on_line();

            /* make sure we have a comma or paren following */
            if (tok == TOKT_COMMA)
            {
                /* we have more arguments - skip the comma */
                tok = next_on_line();
            }
            else if (tok == TOKT_ELLIPSIS)
            {
                /* skip the ellipsis */
                tok = next_on_line();

                /* note the varargs marker */
                has_varargs = TRUE;

                /* this must be the last argument */
                if (tok != TOKT_RPAR)
                {
                    /* log the error */
                    log_error_curtok(TCERR_MACRO_ELLIPSIS_REQ_RPAR);

                    /* discard the line and give up */
                    clear_linebuf();
                    return;
                }

                /* that's the last argument - we can stop now */
                done = TRUE;
            }
            else if (tok == TOKT_RPAR)
            {
                /* no more arguments - note that we can stop now */
                done = TRUE;
            }
            else
            {
                /* invalid argument - log an error and discard the line */
                log_error_curtok(TCERR_MACRO_EXP_COMMA);
                clear_linebuf();
                return;
            }
        }
    }
    else
    {
        /* 
         *   there are no arguments - the macro's expansion starts
         *   immediately after the end of the name and any subsequent
         *   whitespace 
         */
        has_args = FALSE;
    }

    /* skip whitespace leading up to the expansion */
    while (is_space(p_.getch()))
        p_.inc();

    /* the rest of the line is the expansion */
    expan = p_.getptr();

    /* don't allow defining "defined" */
    if (macro_len == 7 && memcmp(macro_name, "defined", 7) == 0)
    {
        /* log an error */
        log_error(TCERR_REDEF_OP_DEFINED);

        /* don't retain the directive in the preprocessed result */
        clear_linebuf();

        /* ignore the definition */
        return;
    }

    /* get the length of the expansion text */
    expan_len = strlen(expan);

    /* 
     *   remove any trailing whitespace from the expansion text; however,
     *   leave a trailing space if it's preceded by a backslash 
     */
    while (expan_len > 0
           && is_space(expan[expan_len-1])
           && !(expan_len > 1 && expan[expan_len-2] == '\\'))
        --expan_len;

    /* create an entry for the new macro */
    entry = new CTcHashEntryPpDefine(macro_name, macro_len, TRUE,
                                     has_args, argc, has_varargs,
                                     argv, argvlen, expan, expan_len);

    /* 
     *   Check the symbol table to see if this symbol is already defined with
     *   a different expansion.  If so, show a warning, but honor the new
     *   definition.  
     */
    old_entry = find_define(macro_name, macro_len);
    if (old_entry != 0)
    {
        /*
         *   Check for a trivial redefinition - if the number of arguments is
         *   the same, and the type (object-like or function-like) is the
         *   same, and the expansion string is identical, there's no need to
         *   warn, because the redefinition has no effect and can thus be
         *   safely ignored.  Note that we must ignore any differences in the
         *   whitespace in the expansions for this comparision.
         *   
         *   Compare the *parsed* versions of the expansions.  This ensures
         *   that we take into account changes to parameter names.  For
         *   example, the following two macros are equivalent, even though
         *   their unparsed source texts are different, because they'd still
         *   have identical expansions for any given parameter value:
         *   
         *.    #define A(x) x
         *.    #define A(y) y
         *   
         *   Likewise, the following two macros are NOT equivalent, even
         *   though their unparsed source texts are identical, because they
         *   could have different expansions for a given parameter value:
         *   
         *.    #define A(x) x
         *.    #define A(y) x
         */
        if ((old_entry->has_args() != 0) == (has_args != 0)
            && old_entry->get_argc() == argc
            && lib_strequal_collapse_spaces(entry->get_expansion(),
                                            entry->get_expan_len(),
                                            old_entry->get_expansion(),
                                            old_entry->get_expan_len()))
        {
            /* it's a non-trivial redefinition - ignore it */
            delete entry;
            goto done;
        }

        /* log a warning about the redefinition */
        log_warning(TCERR_MACRO_REDEF, (int)macro_len, macro_name);

        /* remove and delete the old entry */
        defines_->remove(old_entry);

        /* if the item isn't already in the #undef table, add it */
        if (find_undef(macro_name, macro_len) == 0)
        {
            /* 
             *   move the entry to the #undef table so that we can keep track
             *   of the fact that this macro's definition has changed in the
             *   course of the compilation 
             */
            undefs_->add(old_entry);
        }
        else
        {
            /* 
             *   the name is already in the #undef table, so we don't need
             *   another copy - just forget about the old entry entirely 
             */
            delete old_entry;
        }
    }

    /* add it to the hash table */
    defines_->add(entry);

done:
    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}